

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iprog.c
# Opt level: O0

void fight_prog_arms_light(OBJ_DATA *obj,CHAR_DATA *ch)

{
  bool bVar1;
  int iVar2;
  long in_RSI;
  OBJ_DATA *in_RDI;
  CHAR_DATA *victim;
  AFFECT_DATA af;
  AFFECT_DATA *in_stack_ffffffffffffff78;
  CHAR_DATA *ch_00;
  CHAR_DATA *in_stack_ffffffffffffff88;
  char *in_stack_ffffffffffffff90;
  undefined8 in_stack_ffffffffffffffb0;
  int dam_type;
  CHAR_DATA *in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffc0;
  
  dam_type = (int)((ulong)in_stack_ffffffffffffffb0 >> 0x20);
  ch_00 = *(CHAR_DATA **)(in_RSI + 0x20);
  if (((ch_00 != (CHAR_DATA *)0x0) &&
      (bVar1 = is_affected_obj(in_RDI,(int)gsn_arms_of_light), bVar1)) &&
     (iVar2 = number_percent(), 0x5a < iVar2)) {
    act(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,ch_00,in_stack_ffffffffffffff78,0);
    bVar1 = saves_spell(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,dam_type);
    if (!bVar1) {
      act(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,ch_00,in_stack_ffffffffffffff78,0);
      act(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,ch_00,in_stack_ffffffffffffff78,0);
      init_affect((AFFECT_DATA *)0x66568a);
      std::pow<int,int>(0,0x6656db);
      affect_to_char(ch_00,in_stack_ffffffffffffff78);
    }
  }
  return;
}

Assistant:

void fight_prog_arms_light(OBJ_DATA *obj, CHAR_DATA *ch)
{
	AFFECT_DATA af;
	CHAR_DATA *victim = ch->fighting;

	if (!victim)
		return;

	if (!is_affected_obj(obj, gsn_arms_of_light))
		return;

	if (number_percent() > 90)
	{
		act("$p suddenly flares brightly!", victim, obj, 0, TO_ROOM);

		if (!saves_spell(ch->level, victim, DAM_LIGHT))
		{
			act("$n appears to be blinded.", victim, obj, 0, TO_ROOM);
			act("You are blinded!", ch, 0, victim, TO_VICT);

			init_affect(&af);
			af.where = TO_AFFECTS;
			af.aftype = AFT_SKILL;
			af.type = gsn_blindness;
			af.duration = ch->level / 12;
			af.modifier = -4;
			af.location = APPLY_HITROLL;
			SET_BIT(af.bitvector, AFF_BLIND);
			affect_to_char(victim, &af);
		}
	}
}